

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int nn_base64_encode(uint8_t *in,size_t in_len,char *out,size_t out_len)

{
  uint uVar1;
  ulong in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint8_t ENCODEMAP [64];
  uint8_t ch;
  uint32_t v;
  uint rem;
  uint io;
  uint ii;
  undefined1 auStack_88 [79];
  byte local_39;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  ulong local_28;
  long local_20;
  ulong local_18;
  long local_10;
  uint local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memcpy(auStack_88,&DAT_0016e510,0x40);
  local_30 = 0;
  local_38 = 0;
  local_34 = 0;
  for (local_2c = 0; local_2c < local_18; local_2c = local_2c + 1) {
    local_39 = *(byte *)(local_10 + (ulong)local_2c);
    local_38 = local_38 << 8 | (uint)*(byte *)(local_10 + (ulong)local_2c);
    local_34 = local_34 + 8;
    while (uVar1 = local_30, 5 < local_34) {
      local_34 = local_34 - 6;
      if (local_28 <= local_30) {
        return -0x69;
      }
      local_30 = local_30 + 1;
      *(undefined1 *)(local_20 + (ulong)uVar1) =
           auStack_88[local_38 >> ((byte)local_34 & 0x1f) & 0x3f];
    }
  }
  if (local_34 != 0) {
    local_38 = local_38 << (6U - (char)local_34 & 0x1f);
    if (local_28 <= local_30) {
      return -0x69;
    }
    *(undefined1 *)(local_20 + (ulong)local_30) = auStack_88[local_38 & 0x3f];
    local_30 = local_30 + 1;
  }
  while( true ) {
    if ((local_30 & 3) == 0) {
      if (local_30 < local_28) {
        *(undefined1 *)(local_20 + (ulong)local_30) = 0;
        local_4 = local_30;
      }
      else {
        local_4 = 0xffffff97;
      }
      return local_4;
    }
    if (local_28 <= local_30) break;
    *(undefined1 *)(local_20 + (ulong)local_30) = 0x3d;
    local_30 = local_30 + 1;
  }
  return -0x69;
}

Assistant:

int nn_base64_encode (const uint8_t *in, size_t in_len,
    char *out, size_t out_len)
{
    unsigned ii;
    unsigned io;
    unsigned rem;
    uint32_t v;
    uint8_t ch;

    const uint8_t ENCODEMAP [64] =
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "abcdefghijklmnopqrstuvwxyz"
        "0123456789+/";

    for (io = 0, ii = 0, v = 0, rem = 0; ii < in_len; ii++) {
        ch = in [ii];
        v = (v << 8) | ch;
        rem += 8;
        while (rem >= 6) {
            rem -= 6;
            if (io >= out_len)
                return -ENOBUFS;
            out [io++] = ENCODEMAP [(v >> rem) & 63];
        }
    }

    if (rem) {
        v <<= (6 - rem);
        if (io >= out_len)
            return -ENOBUFS;
        out [io++] = ENCODEMAP [v & 63];
    }

    /*  Pad to a multiple of 3. */
    while (io & 3) {
        if (io >= out_len)
            return -ENOBUFS;
        out [io++] = '=';
    }

    if (io >= out_len)
        return -ENOBUFS;
    
    out [io] = '\0';

    return io;
}